

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GrcManager::CmapAndInverse
          (GrcManager *this,GrcFont *pfont,int cnUni,utf16 *rgchwUniToGlyphID,uint *rgnGlyphIDToUni,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *vnXUniForPsd,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *vwXPsdForUni)

{
  pointer puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  iterator local_40;
  
  lVar8 = 0;
  memset(rgchwUniToGlyphID,0,(long)cnUni * 2);
  memset(rgnGlyphIDToUni,0,0x40000);
  GrcFont::GetGlyphsFromCmap(pfont,rgchwUniToGlyphID);
  uVar6 = (ulong)*(pfont->m_vnMinUnicode).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
  lVar4 = 0;
  local_40.m_pfont = pfont;
  local_40._8_8_ = uVar6;
  do {
    uVar5 = (uint)uVar6;
    if (uVar5 == 0xffffffff) {
      return;
    }
    lVar2 = (long)(int)lVar4;
    lVar4 = lVar4 << 0x20;
    lVar7 = lVar2 * 4;
    lVar3 = lVar2 * 2;
    for (; puVar1 = (this->m_vnUnicodeForPseudo).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
        lVar2 < (int)((ulong)((long)(this->m_vnUnicodeForPseudo).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 2);
        lVar2 = lVar2 + 1) {
      if (uVar5 <= *(uint *)((long)puVar1 + lVar7)) {
        if (*(uint *)((long)puVar1 + (lVar4 >> 0x1e)) == uVar5) {
          rgchwUniToGlyphID[lVar8] =
               (this->m_vwPseudoForUnicode).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start[lVar4 >> 0x20];
          lVar2 = lVar2 + 1;
        }
        break;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (vnXUniForPsd,(value_type_conflict1 *)((long)puVar1 + lVar7));
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (vwXPsdForUni,
                 (value_type_conflict3 *)
                 ((long)(this->m_vwPseudoForUnicode).
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar3));
      lVar4 = lVar4 + 0x100000000;
      lVar7 = lVar7 + 4;
      lVar3 = lVar3 + 2;
    }
    rgnGlyphIDToUni[rgchwUniToGlyphID[lVar8]] = uVar5;
    GrcFont::iterator::operator++(&local_40);
    lVar8 = lVar8 + 1;
    uVar6 = local_40._8_8_ & 0xffffffff;
    lVar4 = lVar2;
  } while( true );
}

Assistant:

void GrcManager::CmapAndInverse(GrcFont * pfont, 
	int cnUni, utf16 * rgchwUniToGlyphID, unsigned int * rgnGlyphIDToUni,
	std::vector<unsigned int> & vnXUniForPsd, std::vector<utf16> & vwXPsdForUni)
{
	memset(rgchwUniToGlyphID, 0, (cnUni * sizeof(utf16)));
	memset(rgnGlyphIDToUni, 0, (0x10000 * sizeof(int)));

	pfont->GetGlyphsFromCmap(rgchwUniToGlyphID);

	// Generate the inverse cmap. Also overwrite the glyph IDs for any pseudos.
	int iUni;
	GrcFont::iterator fit(pfont);
	int iUniPsd = 0;
	for (iUni = 0, fit = pfont->Begin();
		fit != pfont->End();
		++fit, ++iUni)
	{
		unsigned int nUni = *fit;

		// Handle pseudos.
		while (iUniPsd < signed(m_vnUnicodeForPseudo.size()) && nUni > m_vnUnicodeForPseudo[iUniPsd])
		{
			// Put any Unicode -> pseudo mappings where the Unicode is not in the cmap into 
			// a separate list.
			vnXUniForPsd.push_back(m_vnUnicodeForPseudo[iUniPsd]);
			vwXPsdForUni.push_back(m_vwPseudoForUnicode[iUniPsd]);
			iUniPsd++;
		}
		if (iUniPsd < signed(m_vnUnicodeForPseudo.size()) && m_vnUnicodeForPseudo[iUniPsd] == nUni)
		{
			// Pseudo: overwrite glyph ID.
			rgchwUniToGlyphID[iUni] = m_vwPseudoForUnicode[iUniPsd];
			iUniPsd++;
		}
		utf16 wGlyph = rgchwUniToGlyphID[iUni];
		rgnGlyphIDToUni[wGlyph] = nUni;
	}
	Assert(iUni == cnUni);
}